

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uchar paethPredictor(short a,short b,short c)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  undefined6 in_register_00000012;
  undefined2 in_register_00000032;
  uchar uVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  uint uVar6;
  uint uVar7;
  
  uVar2 = (uint)CONCAT62(in_register_00000012,c);
  uVar7 = uVar2 & 0xffff;
  uVar6 = (ushort)b - uVar7;
  uVar3 = -uVar6;
  if (0 < (int)uVar6) {
    uVar3 = uVar6;
  }
  uVar5 = (uint)CONCAT62(in_register_0000003a,a);
  uVar7 = (uVar5 & 0xffff) - uVar7;
  uVar6 = -uVar7;
  if (0 < (int)uVar7) {
    uVar6 = uVar7;
  }
  uVar7 = CONCAT22(in_register_00000032,b) + uVar5 + uVar2 * -2;
  uVar2 = -uVar7;
  if (0 < (int)uVar7) {
    uVar2 = uVar7;
  }
  uVar4 = (uchar)a;
  if ((uVar6 & 0xffff) < (uVar3 & 0xffff)) {
    uVar4 = (uchar)b;
  }
  uVar1 = (uchar)c;
  if ((uVar6 & 0xffff) <= (uVar2 & 0xffff)) {
    uVar1 = uVar4;
  }
  if ((uVar3 & 0xffff) <= (uVar2 & 0xffff)) {
    uVar1 = uVar4;
  }
  return uVar1;
}

Assistant:

static unsigned char paethPredictor(short a, short b, short c)
{
	short pa = abs(b - c);
	short pb = abs(a - c);
	short pc = abs(a + b - c - c);

	if (pc < pa && pc < pb) return (unsigned char)c;
	else if (pb < pa) return (unsigned char)b;
	else return (unsigned char)a;
}